

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void slider_size_cb(Fl_Value_Input *i,void *v)

{
  bool bVar1;
  int iVar2;
  Fl_Group *pFVar3;
  float fVar4;
  double v_00;
  Fl_Widget_Type *q;
  Fl_Type *o;
  double n;
  int mod;
  void *v_local;
  Fl_Value_Input *i_local;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    if (iVar2 == 0) {
      pFVar3 = Fl_Widget::parent((Fl_Widget *)i);
      (*(pFVar3->super_Fl_Widget)._vptr_Fl_Widget[5])();
    }
    else {
      pFVar3 = Fl_Widget::parent((Fl_Widget *)i);
      (*(pFVar3->super_Fl_Widget)._vptr_Fl_Widget[6])();
    }
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1c])();
    if (iVar2 < 2) {
      Fl_Widget::deactivate((Fl_Widget *)i);
    }
    else {
      Fl_Widget::activate((Fl_Widget *)i);
      fVar4 = Fl_Slider::slider_size((Fl_Slider *)current_widget->o);
      Fl_Valuator::value(&i->super_Fl_Valuator,(double)fVar4);
    }
  }
  else {
    bVar1 = false;
    v_00 = Fl_Valuator::value(&i->super_Fl_Valuator);
    for (q = (Fl_Widget_Type *)Fl_Type::first; q != (Fl_Widget_Type *)0x0;
        q = (Fl_Widget_Type *)(q->super_Fl_Type).next) {
      if ((((q->super_Fl_Type).selected != '\0') &&
          (iVar2 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) &&
         (iVar2 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x1c])(), 1 < iVar2)) {
        Fl_Slider::slider_size((Fl_Slider *)q->o,v_00);
        Fl_Widget::redraw(q->o);
        bVar1 = true;
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void slider_size_cb(Fl_Value_Input* i, void* v) {
  if (v == LOAD) {
    if (current_widget->is_window()) 
      i->parent()->hide(); 
    else
      i->parent()->show();
    if (current_widget->is_valuator()<2) {i->deactivate(); return;}
    i->activate();
    i->value(((Fl_Slider*)(current_widget->o))->slider_size());
  } else {
    int mod = 0;
    double n = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	if (q->is_valuator()>=2) {
	  ((Fl_Slider*)(q->o))->slider_size(n);
	  q->o->redraw();
	  mod = 1;
	}
      }
    }
    if (mod) set_modflag(1);
  }
}